

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int GetHeadDataSeanet(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  int iVar1;
  double *pAngle_local;
  uchar *scanline_local;
  SEANET *pSeanet_local;
  
  iVar1 = SendDataRequestSeanet(pSeanet);
  if (iVar1 == 0) {
    iVar1 = HeadDataReplySeanet(pSeanet,scanline,pAngle);
    if (iVar1 == 0) {
      pSeanet_local._4_4_ = 0;
    }
    else {
      pSeanet_local._4_4_ = 1;
    }
  }
  else {
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int GetHeadDataSeanet(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	if (SendDataRequestSeanet(pSeanet) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	if (HeadDataReplySeanet(pSeanet, scanline, pAngle) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Last data...?

	return EXIT_SUCCESS;
}